

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O1

int __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::UArrIntermediateNode::
remove(UArrIntermediateNode *this,char *__filename)

{
  int iVar1;
  bool bVar2;
  int in_EAX;
  undefined1 in_DL;
  long lVar3;
  Top TVar4;
  byte local_50;
  int iStack_4f;
  char cStack_4b;
  int iStack_3f;
  char cStack_3b;
  
  local_50 = (byte)__filename;
  iStack_4f = (int)((ulong)__filename >> 8);
  cStack_4b = (char)((ulong)__filename >> 0x28);
  if (0 < *(int *)&(this->super_IntermediateNode).field_0x14) {
    lVar3 = 0;
    do {
      TVar4 = Kernel::TermList::top(&this->_nodes[lVar3]->_term);
      iStack_3f = TVar4._inner._inner._content._0_4_;
      cStack_3b = TVar4._inner._inner._content[4];
      if (((TVar4._inner._inner._0_1_ ^ local_50) & 1) == 0) {
        bVar2 = CONCAT13(in_DL,(int3)((ulong)__filename >> 0x28)) ==
                TVar4._inner._inner._content._4_4_;
        if (((ulong)__filename & 1) == 0) {
          bVar2 = cStack_4b == cStack_3b;
        }
        if ((iStack_4f == iStack_3f) && (bVar2)) {
          iVar1 = *(int *)&(this->super_IntermediateNode).field_0x14;
          *(int *)&(this->super_IntermediateNode).field_0x14 = iVar1 + -1;
          this->_nodes[lVar3] = this->_nodes[(long)iVar1 + -1];
          this->_nodes[(long)iVar1 + -1] = (Node *)0x0;
          return iVar1;
        }
      }
      lVar3 = lVar3 + 1;
      in_EAX = *(int *)&(this->super_IntermediateNode).field_0x14;
    } while (lVar3 < in_EAX);
  }
  return in_EAX;
}

Assistant:

void SubstitutionTree<LeafData_>::UArrIntermediateNode::remove(TermList::Top t)
{
  for(int i=0;i<_size;i++) {
    if(t == _nodes[i]->top()) {
      _size--;
      _nodes[i]=_nodes[_size];
      _nodes[_size]=0;
      return;
    }
  }
  ASSERTION_VIOLATION;
}